

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *pcVar5;
  cmake *pcVar6;
  ostream *poVar7;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  cmListFileBacktrace local_1c0;
  ostringstream w;
  
  std::__cxx11::string::string((string *)&w,"INTERPROCEDURAL_OPTIMIZATION",(allocator *)&local_1e0);
  pcVar5 = GetFeature(this,(string *)&w,config);
  bVar2 = cmSystemTools::IsOn(pcVar5);
  std::__cxx11::string::~string((string *)&w);
  if ((bVar2) &&
     (((bVar2 = std::operator!=(lang,"C"), !bVar2 || (bVar2 = std::operator!=(lang,"CXX"), !bVar2))
      || (bVar2 = std::operator!=(lang,"Fortran"), !bVar2)))) {
    PVar3 = GetPolicyStatusCMP0069(this);
    pcVar1 = this->Makefile;
    if (PVar3 < NEW) {
      std::operator+(&local_1e0,"_CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                     &local_1e0,"_IPO_LEGACY_BEHAVIOR");
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&local_1e0);
      if (bVar2) {
        return true;
      }
      if (this->PolicyReportedCMP0069 == false) {
        pcVar6 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        bVar2 = cmake::GetIsInTryCompile(pcVar6);
        if (PVar3 != WARN) {
          return false;
        }
        if (bVar2) {
          return false;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x45,id);
        poVar7 = std::operator<<((ostream *)&w,(string *)&local_1e0);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&local_1e0);
        poVar7 = std::operator<<((ostream *)&w,
                                 "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
                                );
        poVar7 = std::operator<<(poVar7,"\'");
        poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
        std::operator<<(poVar7,"\'.");
        pcVar6 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace(&local_1c0,this);
        cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_1e0,&local_1c0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        this->PolicyReportedCMP0069 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
    }
    else {
      std::operator+(&local_1e0,"_CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                     &local_1e0,"_IPO_SUPPORTED_BY_CMAKE");
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&local_1e0);
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::operator+(&local_1e0,"_CMAKE_",lang);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                       &local_1e0,"_IPO_MAY_BE_SUPPORTED_BY_COMPILER");
        bVar2 = cmMakefile::IsOn(pcVar1,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        std::__cxx11::string::~string((string *)&local_1e0);
        if (bVar2) {
          iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x22])();
          if ((char)iVar4 != '\0') {
            return true;
          }
          pcVar5 = "CMake doesn\'t support IPO for current generator";
        }
        else {
          pcVar5 = "Compiler doesn\'t support IPO";
        }
      }
      else {
        pcVar5 = "CMake doesn\'t support IPO for current compiler";
      }
      if (this->PolicyReportedCMP0069 == false) {
        this->PolicyReportedCMP0069 = true;
        pcVar6 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::string::string((string *)&w,pcVar5,(allocator *)&local_1c0);
        GetBacktrace((cmListFileBacktrace *)&local_1e0,this);
        cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&w,(cmListFileBacktrace *)&local_1e0);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_1e0);
        std::__cxx11::string::~string((string *)&w);
      }
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  const char* feature = "INTERPROCEDURAL_OPTIMIZATION";
  const bool result = cmSystemTools::IsOn(this->GetFeature(feature, config));

  if (!result) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        cmake::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = CM_NULLPTR;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}